

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolutiondepthwise_3x3.h
# Opt level: O0

void ncnn::convdw3x3s2_sse(Mat *bottom_blob,Mat *top_blob,Mat *_kernel,Mat *_bias,Option *opt)

{
  int iVar1;
  int iVar2;
  long lVar3;
  long lVar4;
  long lVar5;
  long lVar6;
  int iVar7;
  float *pfVar8;
  long *in_RCX;
  long *in_RDX;
  long *in_RSI;
  long *in_RDI;
  float sum;
  int remain;
  int i;
  float *k2;
  float *k1;
  float *k0;
  float *r2;
  float *r1;
  float *r0;
  float *img0;
  float *outptr;
  float *kernel0;
  float bias0;
  Mat out;
  int g;
  float *bias;
  float *kernel;
  int tailstep;
  int group;
  int outh;
  int outw;
  int w;
  Mat *m;
  Mat *m_1;
  float local_314;
  int local_2f0;
  int local_2ec;
  float *local_2d0;
  float *local_2c8;
  float *local_2c0;
  float *local_258;
  int local_1f4;
  
  iVar1 = *(int *)((long)in_RDI + 0x2c);
  iVar2 = *(int *)((long)in_RSI + 0x2c);
  lVar5 = in_RSI[6];
  lVar6 = in_RDI[7];
  iVar7 = iVar1 * 2 + iVar2 * -2;
  lVar3 = *in_RDX;
  lVar4 = *in_RCX;
  for (local_1f4 = 0; local_1f4 < (int)lVar6; local_1f4 = local_1f4 + 1) {
    local_258 = (float *)(*in_RSI + in_RSI[8] * (long)local_1f4 * in_RSI[2]);
    if (lVar4 == 0) {
      local_314 = 0.0;
    }
    else {
      local_314 = *(float *)(lVar4 + (long)local_1f4 * 4);
    }
    pfVar8 = (float *)(lVar3 + (long)(local_1f4 * 9) * 4);
    local_2c0 = (float *)(*in_RDI + in_RDI[8] * (long)local_1f4 * in_RDI[2]);
    local_2c8 = local_2c0 + iVar1;
    local_2d0 = local_2c0 + (iVar1 << 1);
    for (local_2ec = 0; local_2f0 = iVar2, local_2ec < (int)lVar5; local_2ec = local_2ec + 1) {
      for (; 0 < local_2f0; local_2f0 = local_2f0 + -1) {
        *local_258 = local_2d0[2] * pfVar8[8] +
                     local_2d0[1] * pfVar8[7] +
                     *local_2d0 * pfVar8[6] +
                     local_2c8[2] * pfVar8[5] +
                     local_2c8[1] * pfVar8[4] +
                     *local_2c8 * pfVar8[3] +
                     local_2c0[2] * pfVar8[2] +
                     local_2c0[1] * pfVar8[1] + *local_2c0 * *pfVar8 + local_314;
        local_2c0 = local_2c0 + 2;
        local_2c8 = local_2c8 + 2;
        local_2d0 = local_2d0 + 2;
        local_258 = local_258 + 1;
      }
      local_2c0 = local_2c0 + iVar7;
      local_2c8 = local_2c8 + iVar7;
      local_2d0 = local_2d0 + iVar7;
    }
  }
  return;
}

Assistant:

static void convdw3x3s2_sse(const Mat& bottom_blob, Mat& top_blob, const Mat& _kernel, const Mat& _bias, const Option& opt)
{
    int w = bottom_blob.w;

    int outw = top_blob.w;
    int outh = top_blob.h;

    const int group = bottom_blob.c;

    const int tailstep = w - 2 * outw + w;

    const float* kernel = _kernel;
    const float* bias = _bias;

    #pragma omp parallel for num_threads(opt.num_threads)
    for (int g = 0; g < group; g++)
    {
        Mat out = top_blob.channel(g);

        const float bias0 = bias ? bias[g] : 0.f;

        const float* kernel0 = kernel + g * 9;

        float* outptr = out;

        const float* img0 = bottom_blob.channel(g);

        const float* r0 = img0;
        const float* r1 = img0 + w;
        const float* r2 = img0 + w * 2;

        const float* k0 = kernel0;
        const float* k1 = kernel0 + 3;
        const float* k2 = kernel0 + 6;

        int i = 0;

        for (; i < outh; i++)
        {
            int remain = outw;

            for (; remain > 0; remain--)
            {
                float sum = bias0;
                sum += r0[0] * k0[0];
                sum += r0[1] * k0[1];
                sum += r0[2] * k0[2];
                sum += r1[0] * k1[0];
                sum += r1[1] * k1[1];
                sum += r1[2] * k1[2];
                sum += r2[0] * k2[0];
                sum += r2[1] * k2[1];
                sum += r2[2] * k2[2];

                *outptr = sum;

                r0 += 2;
                r1 += 2;
                r2 += 2;
                outptr++;
            }

            r0 += tailstep;
            r1 += tailstep;
            r2 += tailstep;
        }
    }
}